

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonArrayCompute(sqlite3_context *ctx,int isFinal)

{
  int n;
  JsonString *p;
  void *pvVar1;
  int in_ESI;
  sqlite3_context *in_RDI;
  int flags;
  JsonString *pStr;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  uint in_stack_fffffffffffffff0;
  
  p = (JsonString *)
      sqlite3_aggregate_context
                ((sqlite3_context *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0)
  ;
  if (p == (JsonString *)0x0) {
    sqlite3_result_text((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(char *)0x0,
                        in_stack_ffffffffffffffe4,
                        (_func_void_void_ptr *)
                        CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  else {
    p->pCtx = in_RDI;
    jsonAppendChar((JsonString *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdf);
    pvVar1 = sqlite3_user_data(in_RDI);
    n = (int)pvVar1;
    if (p->eErr != '\0') {
      jsonReturnString((JsonString *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(JsonParse *)p,
                       (sqlite3_context *)CONCAT44(n,in_stack_ffffffffffffffe0));
      return;
    }
    if (((ulong)pvVar1 & 8) != 0) {
      jsonReturnStringAsBlob((JsonString *)0x23a672);
      if (in_ESI == 0) {
        jsonStringTrimOneChar(p);
        return;
      }
      if (p->bStatic != '\0') {
        return;
      }
      sqlite3RCStrUnref((void *)CONCAT44(n,in_stack_ffffffffffffffe0));
      return;
    }
    if (in_ESI == 0) {
      sqlite3_result_text((sqlite3_context *)(ulong)in_stack_fffffffffffffff0,(char *)p,n,
                          (_func_void_void_ptr *)
                          CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      jsonStringTrimOneChar(p);
    }
    else {
      sqlite3_result_text((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(char *)p,n,
                          (_func_void_void_ptr *)
                          CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      p->bStatic = 1;
    }
  }
  sqlite3_result_subtype(in_RDI,0x4a);
  return;
}

Assistant:

static void jsonArrayCompute(sqlite3_context *ctx, int isFinal){
  JsonString *pStr;
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
  if( pStr ){
    int flags;
    pStr->pCtx = ctx;
    jsonAppendChar(pStr, ']');
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
    if( pStr->eErr ){
      jsonReturnString(pStr, 0, 0);
      return;
    }else if( flags & JSON_BLOB ){
      jsonReturnStringAsBlob(pStr);
      if( isFinal ){
        if( !pStr->bStatic ) sqlite3RCStrUnref(pStr->zBuf);
      }else{
        jsonStringTrimOneChar(pStr);
      }
      return;
    }else if( isFinal ){
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed,
                          pStr->bStatic ? SQLITE_TRANSIENT :
                              sqlite3RCStrUnref);
      pStr->bStatic = 1;
    }else{
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed, SQLITE_TRANSIENT);
      jsonStringTrimOneChar(pStr);
    }
  }else{
    sqlite3_result_text(ctx, "[]", 2, SQLITE_STATIC);
  }
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}